

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::UnitTest::UnitTest(UnitTest *this)

{
  UnitTestImpl *this_00;
  
  this->_vptr_UnitTest = (_func_int **)&PTR__UnitTest_0019fe30;
  internal::Mutex::Mutex(&this->mutex_);
  this_00 = (UnitTestImpl *)operator_new(0x2d0);
  internal::UnitTestImpl::UnitTestImpl(this_00,this);
  this->impl_ = this_00;
  return;
}

Assistant:

UnitTest::UnitTest() { impl_ = new internal::UnitTestImpl(this); }